

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

int outformatlen(char *s,uint slen)

{
  uchar uVar1;
  runsdef *prVar2;
  bool bVar3;
  int iVar4;
  int in_ESI;
  uchar *in_RDI;
  uchar *p;
  runsdef val;
  int called_filter;
  int ret;
  char *orig_s;
  uint orig_slen;
  char c;
  int in_stack_000000f8;
  objnum in_stack_000000fe;
  runcxdef *in_stack_00000100;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  out_stream_info *in_stack_00000418;
  undefined8 in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  anon_union_8_4_1dda36f5_for_runsv in_stack_ffffffffffffffd0;
  int local_24;
  int local_c;
  uchar *local_8;
  
  local_24 = 0;
  bVar3 = false;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (G_user_filter != 0xffff) {
    runpstr((runcxdef *)in_stack_ffffffffffffffd0.runsvstr,in_stack_ffffffffffffffc8,
            (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0);
    runfn(in_stack_00000100,in_stack_000000fe,in_stack_000000f8);
    bVar3 = true;
    if (runctx->runcxsp[-1].runstyp == '\x03') {
      prVar2 = runctx->runcxsp;
      runctx->runcxsp = prVar2 + -1;
      local_8 = prVar2[-1].runsv.runsvstr;
      local_c = osrp2(local_8);
      local_c = local_c + -2;
      local_8 = local_8 + 2;
      runrepush(runctx,(runsdef *)&stack0xffffffffffffffc8);
    }
  }
  if (local_c == 0) {
    uVar1 = '\0';
  }
  else {
    uVar1 = *local_8;
  }
  if (uVar1 != '\0') {
    outcnt = '\x01';
  }
  iVar4 = out_is_hidden();
  if (((iVar4 == 0) && (outwxflag == '\0')) &&
     (local_24 = outformatlen_stream(in_stack_00000418,in_stack_00000410,in_stack_00000408),
     logfp != (osfildef *)0x0)) {
    outformatlen_stream(in_stack_00000418,in_stack_00000410,in_stack_00000408);
    fflush((FILE *)logfp);
  }
  if (bVar3) {
    runctx->runcxsp = runctx->runcxsp + -1;
  }
  return local_24;
}

Assistant:

int outformatlen(char *s, uint slen)
{
    char     c;
    uint     orig_slen;
    char    *orig_s;
    int      ret;
    int      called_filter;

    /* presume we'll return success */
    ret = 0;

    /* presume we won't call the filter function */
    called_filter = FALSE;

    /* if there's a user filter function to invoke, call it */
    if (G_user_filter != MCMONINV)
    {
        /* push the string */
        runpstr(runctx, s, slen, 1);

        /* call the filter */
        runfn(runctx, G_user_filter, 1);

        /* 
         *   note that we called the filter, so that we'll remove the
         *   result of the filter from the stack before we return 
         */
        called_filter = TRUE;

        /* if the result is a string, use it in place of the original text */
        if (runtostyp(runctx) == DAT_SSTRING)
        {
            runsdef val;
            uchar *p;

            /* pop the value */
            runpop(runctx, &val);

            /* 
             *   get the text from the string, and use it as a replacement
             *   for the original string 
             */
            p = val.runsv.runsvstr;
            slen = osrp2(p) - 2;
            s = (char *)(p + 2);

            /* 
             *   push the string back onto the stack - this will ensure
             *   that the string stays referenced while we're working, so
             *   that the garbage collector won't delete it 
             */
            runrepush(runctx, &val);
        }
    }

    /* remember the original string, before we scan the first character */
    orig_s = s;
    orig_slen = slen;

    /* get the first character to display */
    c = nextout(&s, &slen);

    /* if the string is non-empty, note that we've displayed something */
    if (c != 0)
        outcnt = 1;

    /* check to see if we're hiding output */
    if (out_is_hidden())
        goto done;

    /* if the debugger is showing watchpoints, suppress all output */
    if (outwxflag)
        goto done;

    /* display the string */
    ret = outformatlen_stream(&G_std_disp, orig_s, orig_slen);

    /* if there's a log file, write to the log file as well */
    if (logfp != 0)
    {
        outformatlen_stream(&G_log_disp, orig_s, orig_slen);
        osfflush(logfp);
    }

done:
    /* if we called the filter, remove the result from the stack */
    if (called_filter)
        rundisc(runctx);

    /* return the result from displaying to the screen */
    return ret;
}